

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O0

void __thiscall Rml::BaseXMLParser::BaseXMLParser(BaseXMLParser *this)

{
  BaseXMLParser *this_local;
  
  this->_vptr_BaseXMLParser = (_func_int **)&PTR__BaseXMLParser_00814d90;
  this->source_url = (URL *)0x0;
  ::std::__cxx11::string::string((string *)&this->xml_source);
  this->xml_index = 0;
  this->line_number = 0;
  this->line_number_open_tag = 0;
  this->open_tag_depth = 0;
  this->inner_xml_data = false;
  this->inner_xml_data_terminate_depth = 0;
  this->inner_xml_data_index_begin = 0;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&this->attributes);
  ::std::__cxx11::string::string((string *)&this->data);
  itlib::
  flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_set(&this->cdata_tags);
  itlib::
  flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_set(&this->attributes_for_inner_xml_data);
  return;
}

Assistant:

BaseXMLParser::BaseXMLParser() {}